

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O2

CHUNKcode Curl_httpchunk_read(connectdata *conn,char *datap,ssize_t datalen,ssize_t *wrotep)

{
  curl_off_t *num;
  int *piVar1;
  int iVar2;
  Curl_easy *pCVar3;
  contenc_writer *writer;
  CURLcode CVar4;
  int iVar5;
  CURLofft CVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  char cVar10;
  char *endptr;
  
  pCVar3 = conn->data;
  *wrotep = 0;
  if ((((pCVar3->set).http_te_skip == true) && ((pCVar3->req).ignorebody == false)) &&
     (CVar4 = Curl_client_write(conn,1,datap,datalen), CVar4 != CURLE_OK)) {
    return CHUNKE_WRITE_ERROR;
  }
  num = &(conn->chunk).datasize;
switchD_00125f92_default:
  if (datalen == 0) {
    return CHUNKE_OK;
  }
  switch((conn->chunk).state) {
  case CHUNK_HEX:
    iVar5 = Curl_isxdigit((int)*datap);
    if (iVar5 != 0) {
      lVar7 = (long)(conn->chunk).hexindex;
      if (0xf < lVar7) {
        return CHUNKE_TOO_LONG_HEX;
      }
      (conn->chunk).hexbuffer[lVar7] = *datap;
      datap = datap + 1;
      datalen = datalen + -1;
      piVar1 = &(conn->chunk).hexindex;
      *piVar1 = *piVar1 + 1;
      goto switchD_00125f92_default;
    }
    lVar7 = (long)(conn->chunk).hexindex;
    if (lVar7 != 0) {
      (conn->chunk).hexbuffer[lVar7] = '\0';
      CVar6 = curlx_strtoofft((conn->chunk).hexbuffer,&endptr,0x10,num);
      if (CVar6 == CURL_OFFT_OK) {
        (conn->chunk).state = CHUNK_LF;
        goto switchD_00125f92_default;
      }
    }
    return CHUNKE_ILLEGAL_HEX;
  case CHUNK_LF:
    if (*datap == '\n') {
      if (*num == 0) {
        (conn->chunk).state = CHUNK_TRAILER;
        conn->trlPos = 0;
      }
      else {
        (conn->chunk).state = CHUNK_DATA;
      }
    }
    break;
  case CHUNK_DATA:
    lVar7 = (conn->chunk).datasize;
    if (datalen <= lVar7) {
      lVar7 = datalen;
    }
    sVar9 = curlx_sotouz(lVar7);
    if (((conn->data->set).http_te_skip == false) && ((pCVar3->req).ignorebody == false)) {
      if (((conn->data->set).http_ce_skip == false) &&
         (writer = (pCVar3->req).writer_stack, writer != (contenc_writer *)0x0)) {
        CVar4 = Curl_unencode_write(conn,writer,datap,sVar9);
      }
      else {
        CVar4 = Curl_client_write(conn,1,datap,sVar9);
      }
      if (CVar4 != CURLE_OK) {
        return CHUNKE_WRITE_ERROR;
      }
    }
    *wrotep = *wrotep + sVar9;
    datap = datap + sVar9;
    datalen = datalen - sVar9;
    *num = *num - sVar9;
    if (*num == 0) {
      (conn->chunk).state = CHUNK_POSTLF;
    }
    goto switchD_00125f92_default;
  case CHUNK_POSTLF:
    if (*datap != '\r') {
      if (*datap != '\n') {
        return CHUNKE_BAD_CHUNK;
      }
      (conn->chunk).hexindex = 0;
      (conn->chunk).state = CHUNK_HEX;
      (conn->chunk).dataleft = 0;
    }
    break;
  case CHUNK_STOP:
    goto switchD_00125f92_caseD_4;
  case CHUNK_TRAILER:
    cVar10 = *datap;
    if ((cVar10 == '\r') || (cVar10 == '\n')) {
      iVar5 = conn->trlPos;
      if ((long)iVar5 == 0) {
        (conn->chunk).state = CHUNK_TRAILER_POSTCR;
        goto switchD_00125f92_default;
      }
      conn->trlPos = iVar5 + 1;
      conn->trailer[iVar5] = '\r';
      iVar5 = conn->trlPos;
      conn->trlPos = iVar5 + 1;
      conn->trailer[iVar5] = '\n';
      conn->trailer[conn->trlPos] = '\0';
      if (((pCVar3->set).http_te_skip == false) &&
         (CVar4 = Curl_client_write(conn,2,conn->trailer,(long)conn->trlPos), CVar4 != CURLE_OK)) {
        return CHUNKE_WRITE_ERROR;
      }
      conn->trlPos = 0;
      (conn->chunk).state = CHUNK_TRAILER_CR;
      if (*datap == '\n') goto switchD_00125f92_default;
    }
    else {
      iVar5 = conn->trlPos;
      iVar2 = conn->trlMax;
      if (iVar5 < iVar2) {
        pcVar8 = conn->trailer;
      }
      else {
        if (iVar2 == 0) {
          conn->trlMax = 0x80;
          pcVar8 = (char *)(*Curl_cmalloc)(0x83);
        }
        else {
          conn->trlMax = iVar2 * 2;
          pcVar8 = (char *)(*Curl_crealloc)(conn->trailer,(long)iVar2 * 2 + 3);
        }
        if (pcVar8 == (char *)0x0) {
          return CHUNKE_OUT_OF_MEMORY;
        }
        conn->trailer = pcVar8;
        cVar10 = *datap;
        iVar5 = conn->trlPos;
      }
      conn->trlPos = iVar5 + 1;
      pcVar8[iVar5] = cVar10;
    }
    break;
  case CHUNK_TRAILER_CR:
    if (*datap != '\n') {
      return CHUNKE_BAD_CHUNK;
    }
    (conn->chunk).state = CHUNK_TRAILER_POSTCR;
    break;
  case CHUNK_TRAILER_POSTCR:
    cVar10 = *datap;
    if ((cVar10 == '\n') || (cVar10 == '\r')) {
      datap = datap + (cVar10 == '\r');
      datalen = datalen - (ulong)(cVar10 == '\r');
      (conn->chunk).state = CHUNK_STOP;
    }
    else {
      (conn->chunk).state = CHUNK_TRAILER;
    }
  default:
    goto switchD_00125f92_default;
  }
  datap = datap + 1;
  datalen = datalen + -1;
  goto switchD_00125f92_default;
switchD_00125f92_caseD_4:
  if (*datap == '\n') {
    sVar9 = curlx_sotouz(datalen + -1);
    (conn->chunk).dataleft = sVar9;
    return CHUNKE_STOP;
  }
  return CHUNKE_BAD_CHUNK;
}

Assistant:

CHUNKcode Curl_httpchunk_read(struct connectdata *conn,
                              char *datap,
                              ssize_t datalen,
                              ssize_t *wrotep)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct Curl_chunker *ch = &conn->chunk;
  struct SingleRequest *k = &data->req;
  size_t piece;
  curl_off_t length = (curl_off_t)datalen;
  size_t *wrote = (size_t *)wrotep;

  *wrote = 0; /* nothing's written yet */

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length*/
  if(data->set.http_te_skip && !k->ignorebody) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, datap, datalen);
    if(result)
      return CHUNKE_WRITE_ERROR;
  }

  while(length) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(Curl_isxdigit_ascii(*datap)) {
        if(ch->hexindex < MAXNUM_SIZE) {
          ch->hexbuffer[ch->hexindex] = *datap;
          datap++;
          length--;
          ch->hexindex++;
        }
        else {
          return CHUNKE_TOO_LONG_HEX; /* longer hex than we support */
        }
      }
      else {
        char *endptr;
        if(0 == ch->hexindex)
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          return CHUNKE_ILLEGAL_HEX;

        /* length and datap are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;

        /* convert to host encoding before calling strtoul */
        result = Curl_convert_from_network(conn->data, ch->hexbuffer,
                                           ch->hexindex);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          /* Treat it as a bad hex character */
          return CHUNKE_ILLEGAL_HEX;
        }

        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize))
          return CHUNKE_ILLEGAL_HEX;
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*datap == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
          conn->trlPos = 0;
        }
        else
          ch->state = CHUNK_DATA;
      }

      datap++;
      length--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'length' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = curlx_sotouz((ch->datasize >= length)?length:ch->datasize);

      /* Write the data portion available */
      if(!conn->data->set.http_te_skip && !k->ignorebody) {
        if(!conn->data->set.http_ce_skip && k->writer_stack)
          result = Curl_unencode_write(conn, k->writer_stack, datap, piece);
        else
          result = Curl_client_write(conn, CLIENTWRITE_BODY, datap, piece);

        if(result)
          return CHUNKE_WRITE_ERROR;
      }

      *wrote += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      datap += piece;    /* move read pointer forward */
      length -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*datap == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_init(conn); /* sets state back to CHUNK_HEX */
      }
      else if(*datap != 0x0d)
        return CHUNKE_BAD_CHUNK;
      datap++;
      length--;
      break;

    case CHUNK_TRAILER:
      if((*datap == 0x0d) || (*datap == 0x0a)) {
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(conn->trlPos) {
          /* we allocate trailer with 3 bytes extra room to fit this */
          conn->trailer[conn->trlPos++] = 0x0d;
          conn->trailer[conn->trlPos++] = 0x0a;
          conn->trailer[conn->trlPos] = 0;

          /* Convert to host encoding before calling Curl_client_write */
          result = Curl_convert_from_network(conn->data, conn->trailer,
                                             conn->trlPos);
          if(result)
            /* Curl_convert_from_network calls failf if unsuccessful */
            /* Treat it as a bad chunk */
            return CHUNKE_BAD_CHUNK;

          if(!data->set.http_te_skip) {
            result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                       conn->trailer, conn->trlPos);
            if(result)
              return CHUNKE_WRITE_ERROR;
          }
          conn->trlPos = 0;
          ch->state = CHUNK_TRAILER_CR;
          if(*datap == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        /* conn->trailer is assumed to be freed in url.c on a
           connection basis */
        if(conn->trlPos >= conn->trlMax) {
          /* we always allocate three extra bytes, just because when the full
             header has been received we append CRLF\0 */
          char *ptr;
          if(conn->trlMax) {
            conn->trlMax *= 2;
            ptr = realloc(conn->trailer, conn->trlMax + 3);
          }
          else {
            conn->trlMax = 128;
            ptr = malloc(conn->trlMax + 3);
          }
          if(!ptr)
            return CHUNKE_OUT_OF_MEMORY;
          conn->trailer = ptr;
        }
        conn->trailer[conn->trlPos++]=*datap;
      }
      datap++;
      length--;
      break;

    case CHUNK_TRAILER_CR:
      if(*datap == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        datap++;
        length--;
      }
      else
        return CHUNKE_BAD_CHUNK;
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*datap != 0x0d) && (*datap != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*datap == 0x0d) {
        /* skip if CR */
        datap++;
        length--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*datap == 0x0a) {
        length--;

        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->dataleft = curlx_sotouz(length);

        return CHUNKE_STOP; /* return stop */
      }
      else
        return CHUNKE_BAD_CHUNK;
    }
  }
  return CHUNKE_OK;
}